

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  byte bVar25;
  int iVar26;
  ulong *puVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong *puVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong *unaff_R14;
  ulong uVar36;
  float fVar37;
  uint uVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  uint uVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  vint4 bi;
  float fVar50;
  uint uVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  uint uVar56;
  uint uVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  uint uVar62;
  uint uVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  uint uVar68;
  uint uVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  vint4 ai;
  float fVar73;
  uint uVar74;
  uint uVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  uint uVar79;
  float fVar80;
  float fVar81;
  uint uVar82;
  float fVar83;
  float fVar84;
  uint uVar85;
  float fVar86;
  float fVar87;
  vint4 ai_1;
  uint uVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  NodeRef stack [244];
  ulong *local_950;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar12 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar13 = (tray->tnear).field_0.i[k];
  iVar14 = (tray->tfar).field_0.i[k];
  local_950 = local_7d0;
LAB_00706442:
  do {
    puVar31 = local_950;
    if (puVar31 == &local_7d8) {
LAB_00706c0a:
      return puVar31 != &local_7d8;
    }
    puVar27 = puVar31 + -1;
    uVar34 = puVar31[-1];
    local_950 = puVar27;
    while ((uVar34 & 8) == 0) {
      pfVar1 = (float *)(uVar34 + 0x20 + uVar29);
      fVar37 = (*pfVar1 - fVar7) * fVar10;
      fVar41 = (pfVar1[1] - fVar7) * fVar10;
      fVar45 = (pfVar1[2] - fVar7) * fVar10;
      fVar50 = (pfVar1[3] - fVar7) * fVar10;
      pfVar1 = (float *)(uVar34 + 0x20 + uVar32);
      fVar55 = (*pfVar1 - fVar8) * fVar11;
      fVar61 = (pfVar1[1] - fVar8) * fVar11;
      fVar67 = (pfVar1[2] - fVar8) * fVar11;
      fVar73 = (pfVar1[3] - fVar8) * fVar11;
      uVar56 = (uint)((int)fVar55 < (int)fVar37) * (int)fVar37 |
               (uint)((int)fVar55 >= (int)fVar37) * (int)fVar55;
      uVar62 = (uint)((int)fVar61 < (int)fVar41) * (int)fVar41 |
               (uint)((int)fVar61 >= (int)fVar41) * (int)fVar61;
      uVar68 = (uint)((int)fVar67 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar67 >= (int)fVar45) * (int)fVar67;
      uVar74 = (uint)((int)fVar73 < (int)fVar50) * (int)fVar50 |
               (uint)((int)fVar73 >= (int)fVar50) * (int)fVar73;
      pfVar1 = (float *)(uVar34 + 0x20 + uVar33);
      fVar37 = (*pfVar1 - fVar9) * fVar12;
      fVar41 = (pfVar1[1] - fVar9) * fVar12;
      fVar45 = (pfVar1[2] - fVar9) * fVar12;
      fVar50 = (pfVar1[3] - fVar9) * fVar12;
      uVar38 = (uint)((int)fVar37 < iVar13) * iVar13 | (uint)((int)fVar37 >= iVar13) * (int)fVar37;
      uVar42 = (uint)((int)fVar41 < iVar13) * iVar13 | (uint)((int)fVar41 >= iVar13) * (int)fVar41;
      uVar46 = (uint)((int)fVar45 < iVar13) * iVar13 | (uint)((int)fVar45 >= iVar13) * (int)fVar45;
      uVar51 = (uint)((int)fVar50 < iVar13) * iVar13 | (uint)((int)fVar50 >= iVar13) * (int)fVar50;
      pfVar1 = (float *)(uVar34 + 0x20 + (uVar29 ^ 0x10));
      fVar37 = (*pfVar1 - fVar7) * fVar10;
      fVar41 = (pfVar1[1] - fVar7) * fVar10;
      fVar45 = (pfVar1[2] - fVar7) * fVar10;
      fVar50 = (pfVar1[3] - fVar7) * fVar10;
      pfVar1 = (float *)(uVar34 + 0x20 + (uVar32 ^ 0x10));
      fVar55 = (*pfVar1 - fVar8) * fVar11;
      fVar61 = (pfVar1[1] - fVar8) * fVar11;
      fVar67 = (pfVar1[2] - fVar8) * fVar11;
      fVar73 = (pfVar1[3] - fVar8) * fVar11;
      uVar79 = (uint)((int)fVar37 < (int)fVar55) * (int)fVar37 |
               (uint)((int)fVar37 >= (int)fVar55) * (int)fVar55;
      uVar82 = (uint)((int)fVar41 < (int)fVar61) * (int)fVar41 |
               (uint)((int)fVar41 >= (int)fVar61) * (int)fVar61;
      uVar85 = (uint)((int)fVar45 < (int)fVar67) * (int)fVar45 |
               (uint)((int)fVar45 >= (int)fVar67) * (int)fVar67;
      uVar88 = (uint)((int)fVar50 < (int)fVar73) * (int)fVar50 |
               (uint)((int)fVar50 >= (int)fVar73) * (int)fVar73;
      pfVar1 = (float *)(uVar34 + 0x20 + (uVar33 ^ 0x10));
      fVar37 = (*pfVar1 - fVar9) * fVar12;
      fVar41 = (pfVar1[1] - fVar9) * fVar12;
      fVar45 = (pfVar1[2] - fVar9) * fVar12;
      fVar50 = (pfVar1[3] - fVar9) * fVar12;
      uVar57 = (uint)(iVar14 < (int)fVar37) * iVar14 | (uint)(iVar14 >= (int)fVar37) * (int)fVar37;
      uVar63 = (uint)(iVar14 < (int)fVar41) * iVar14 | (uint)(iVar14 >= (int)fVar41) * (int)fVar41;
      uVar69 = (uint)(iVar14 < (int)fVar45) * iVar14 | (uint)(iVar14 >= (int)fVar45) * (int)fVar45;
      uVar75 = (uint)(iVar14 < (int)fVar50) * iVar14 | (uint)(iVar14 >= (int)fVar50) * (int)fVar50;
      auVar17._4_4_ =
           -(uint)((int)(((int)uVar82 < (int)uVar63) * uVar82 |
                        ((int)uVar82 >= (int)uVar63) * uVar63) <
                  (int)(((int)uVar42 < (int)uVar62) * uVar62 | ((int)uVar42 >= (int)uVar62) * uVar42
                       ));
      auVar17._0_4_ =
           -(uint)((int)(((int)uVar79 < (int)uVar57) * uVar79 |
                        ((int)uVar79 >= (int)uVar57) * uVar57) <
                  (int)(((int)uVar38 < (int)uVar56) * uVar56 | ((int)uVar38 >= (int)uVar56) * uVar38
                       ));
      auVar17._8_4_ =
           -(uint)((int)(((int)uVar85 < (int)uVar69) * uVar85 |
                        ((int)uVar85 >= (int)uVar69) * uVar69) <
                  (int)(((int)uVar46 < (int)uVar68) * uVar68 | ((int)uVar46 >= (int)uVar68) * uVar46
                       ));
      auVar17._12_4_ =
           -(uint)((int)(((int)uVar88 < (int)uVar75) * uVar88 |
                        ((int)uVar88 >= (int)uVar75) * uVar75) <
                  (int)(((int)uVar51 < (int)uVar74) * uVar74 | ((int)uVar51 >= (int)uVar74) * uVar51
                       ));
      iVar26 = movmskps((int)puVar27,auVar17);
      if (iVar26 == 0xf) goto LAB_00706442;
      bVar25 = (byte)iVar26 ^ 0xf;
      puVar27 = (ulong *)(uVar34 & 0xfffffffffffffff0);
      lVar30 = 0;
      if (bVar25 != 0) {
        for (; (bVar25 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
        }
      }
      uVar34 = puVar27[lVar30];
      uVar38 = bVar25 - 1 & (uint)bVar25;
      uVar35 = (ulong)uVar38;
      if (uVar38 != 0) {
        do {
          *local_950 = uVar34;
          unaff_R14 = local_950 + 1;
          lVar30 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          uVar34 = puVar27[lVar30];
          uVar35 = uVar35 - 1 & uVar35;
          local_950 = unaff_R14;
        } while (uVar35 != 0);
      }
    }
    uVar35 = uVar34 & 0xfffffffffffffff0;
    for (lVar30 = 0; lVar30 != (ulong)((uint)uVar34 & 0xf) - 8; lVar30 = lVar30 + 1) {
      lVar28 = lVar30 * 0xe0;
      pfVar1 = (float *)(uVar35 + lVar28);
      fVar67 = *pfVar1;
      fVar73 = pfVar1[1];
      fVar48 = pfVar1[2];
      fVar53 = pfVar1[3];
      pfVar1 = (float *)(uVar35 + 0x10 + lVar28);
      fVar103 = *pfVar1;
      fVar105 = pfVar1[1];
      fVar107 = pfVar1[2];
      fVar109 = pfVar1[3];
      pfVar1 = (float *)(uVar35 + 0x20 + lVar28);
      fVar91 = *pfVar1;
      fVar93 = pfVar1[1];
      fVar95 = pfVar1[2];
      fVar97 = pfVar1[3];
      pfVar1 = (float *)(uVar35 + 0x40 + lVar28);
      fVar58 = fVar103 - *pfVar1;
      fVar64 = fVar105 - pfVar1[1];
      fVar70 = fVar107 - pfVar1[2];
      fVar76 = fVar109 - pfVar1[3];
      pfVar2 = (float *)(uVar35 + 0x50 + lVar28);
      fVar59 = fVar91 - *pfVar2;
      fVar65 = fVar93 - pfVar2[1];
      fVar71 = fVar95 - pfVar2[2];
      fVar77 = fVar97 - pfVar2[3];
      pfVar4 = (float *)(uVar35 + 0x90 + lVar28);
      fVar39 = *pfVar4 - fVar67;
      fVar43 = pfVar4[1] - fVar73;
      fVar47 = pfVar4[2] - fVar48;
      fVar52 = pfVar4[3] - fVar53;
      pfVar5 = (float *)(uVar35 + 0xa0 + lVar28);
      fVar99 = *pfVar5 - fVar103;
      fVar100 = pfVar5[1] - fVar105;
      fVar101 = pfVar5[2] - fVar107;
      fVar102 = pfVar5[3] - fVar109;
      pfVar6 = (float *)(uVar35 + 0xb0 + lVar28);
      fVar80 = *pfVar6 - fVar91;
      fVar83 = pfVar6[1] - fVar93;
      fVar86 = pfVar6[2] - fVar95;
      fVar89 = pfVar6[3] - fVar97;
      fVar81 = fVar59 * fVar99 - fVar58 * fVar80;
      fVar84 = fVar65 * fVar100 - fVar64 * fVar83;
      fVar87 = fVar71 * fVar101 - fVar70 * fVar86;
      fVar90 = fVar77 * fVar102 - fVar76 * fVar89;
      fVar37 = *(float *)(ray + k * 4);
      fVar41 = *(float *)(ray + k * 4 + 0x10);
      fVar45 = *(float *)(ray + k * 4 + 0x40);
      fVar50 = *(float *)(ray + k * 4 + 0x50);
      fVar115 = fVar67 - fVar37;
      fVar117 = fVar73 - fVar37;
      fVar119 = fVar48 - fVar37;
      fVar121 = fVar53 - fVar37;
      fVar103 = fVar103 - fVar41;
      fVar105 = fVar105 - fVar41;
      fVar107 = fVar107 - fVar41;
      fVar109 = fVar109 - fVar41;
      fVar111 = fVar115 * fVar50 - fVar103 * fVar45;
      fVar112 = fVar117 * fVar50 - fVar105 * fVar45;
      fVar113 = fVar119 * fVar50 - fVar107 * fVar45;
      fVar114 = fVar121 * fVar50 - fVar109 * fVar45;
      pfVar3 = (float *)(uVar35 + 0x30 + lVar28);
      fVar67 = fVar67 - *pfVar3;
      fVar73 = fVar73 - pfVar3[1];
      fVar48 = fVar48 - pfVar3[2];
      fVar53 = fVar53 - pfVar3[3];
      fVar40 = fVar67 * fVar80 - fVar59 * fVar39;
      fVar44 = fVar73 * fVar83 - fVar65 * fVar43;
      fVar49 = fVar48 * fVar86 - fVar71 * fVar47;
      fVar54 = fVar53 * fVar89 - fVar77 * fVar52;
      fVar55 = *(float *)(ray + k * 4 + 0x20);
      fVar61 = *(float *)(ray + k * 4 + 0x60);
      fVar91 = fVar91 - fVar55;
      fVar93 = fVar93 - fVar55;
      fVar95 = fVar95 - fVar55;
      fVar97 = fVar97 - fVar55;
      fVar104 = fVar91 * fVar45 - fVar115 * fVar61;
      fVar106 = fVar93 * fVar45 - fVar117 * fVar61;
      fVar108 = fVar95 * fVar45 - fVar119 * fVar61;
      fVar110 = fVar97 * fVar45 - fVar121 * fVar61;
      fVar60 = fVar58 * fVar39 - fVar67 * fVar99;
      fVar66 = fVar64 * fVar43 - fVar73 * fVar100;
      fVar72 = fVar70 * fVar47 - fVar48 * fVar101;
      fVar78 = fVar76 * fVar52 - fVar53 * fVar102;
      fVar92 = fVar103 * fVar61 - fVar91 * fVar50;
      fVar94 = fVar105 * fVar61 - fVar93 * fVar50;
      fVar96 = fVar107 * fVar61 - fVar95 * fVar50;
      fVar98 = fVar109 * fVar61 - fVar97 * fVar50;
      fVar116 = fVar81 * fVar45 + fVar40 * fVar50 + fVar60 * fVar61;
      fVar118 = fVar84 * fVar45 + fVar44 * fVar50 + fVar66 * fVar61;
      fVar120 = fVar87 * fVar45 + fVar49 * fVar50 + fVar72 * fVar61;
      fVar122 = fVar90 * fVar45 + fVar54 * fVar50 + fVar78 * fVar61;
      uVar42 = (uint)fVar116 & 0x80000000;
      uVar46 = (uint)fVar118 & 0x80000000;
      uVar51 = (uint)fVar120 & 0x80000000;
      uVar56 = (uint)fVar122 & 0x80000000;
      fVar39 = (float)((uint)(fVar39 * fVar92 + fVar99 * fVar104 + fVar80 * fVar111) ^ uVar42);
      fVar43 = (float)((uint)(fVar43 * fVar94 + fVar100 * fVar106 + fVar83 * fVar112) ^ uVar46);
      fVar47 = (float)((uint)(fVar47 * fVar96 + fVar101 * fVar108 + fVar86 * fVar113) ^ uVar51);
      fVar52 = (float)((uint)(fVar52 * fVar98 + fVar102 * fVar110 + fVar89 * fVar114) ^ uVar56);
      fVar67 = (float)((uint)(fVar92 * fVar67 + fVar104 * fVar58 + fVar111 * fVar59) ^ uVar42);
      fVar73 = (float)((uint)(fVar94 * fVar73 + fVar106 * fVar64 + fVar112 * fVar65) ^ uVar46);
      fVar48 = (float)((uint)(fVar96 * fVar48 + fVar108 * fVar70 + fVar113 * fVar71) ^ uVar51);
      fVar53 = (float)((uint)(fVar98 * fVar53 + fVar110 * fVar76 + fVar114 * fVar77) ^ uVar56);
      fVar58 = ABS(fVar116);
      fVar59 = ABS(fVar118);
      fVar64 = ABS(fVar120);
      fVar65 = ABS(fVar122);
      bVar21 = ((0.0 <= fVar67 && 0.0 <= fVar39) && fVar116 != 0.0) && fVar39 + fVar67 <= fVar58;
      bVar22 = ((0.0 <= fVar73 && 0.0 <= fVar43) && fVar118 != 0.0) && fVar43 + fVar73 <= fVar59;
      bVar23 = ((0.0 <= fVar48 && 0.0 <= fVar47) && fVar120 != 0.0) && fVar47 + fVar48 <= fVar64;
      bVar24 = ((0.0 <= fVar53 && 0.0 <= fVar52) && fVar122 != 0.0) && fVar52 + fVar53 <= fVar65;
      lVar28 = lVar28 + uVar35;
      auVar16._4_4_ = -(uint)bVar22;
      auVar16._0_4_ = -(uint)bVar21;
      auVar16._8_4_ = -(uint)bVar23;
      auVar16._12_4_ = -(uint)bVar24;
      uVar38 = movmskps((int)unaff_R14,auVar16);
      if (uVar38 != 0) {
        fVar48 = (float)(uVar42 ^ (uint)(fVar81 * fVar115 + fVar40 * fVar103 + fVar60 * fVar91));
        fVar53 = (float)(uVar46 ^ (uint)(fVar84 * fVar117 + fVar44 * fVar105 + fVar66 * fVar93));
        fVar103 = (float)(uVar51 ^ (uint)(fVar87 * fVar119 + fVar49 * fVar107 + fVar72 * fVar95));
        fVar105 = (float)(uVar56 ^ (uint)(fVar90 * fVar121 + fVar54 * fVar109 + fVar78 * fVar97));
        fVar67 = *(float *)(ray + k * 4 + 0x30);
        fVar73 = *(float *)(ray + k * 4 + 0x80);
        auVar19._4_4_ = -(uint)((fVar53 <= fVar73 * fVar59 && fVar67 * fVar59 < fVar53) && bVar22);
        auVar19._0_4_ = -(uint)((fVar48 <= fVar73 * fVar58 && fVar67 * fVar58 < fVar48) && bVar21);
        auVar19._8_4_ = -(uint)((fVar103 <= fVar73 * fVar64 && fVar67 * fVar64 < fVar103) && bVar23)
        ;
        auVar19._12_4_ =
             -(uint)((fVar105 <= fVar73 * fVar65 && fVar67 * fVar65 < fVar105) && bVar24);
        uVar38 = movmskps(uVar38,auVar19);
        if (uVar38 != 0) {
          uVar36 = (ulong)(uVar38 & 0xff);
          do {
            uVar15 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            if ((((context->scene->geometries).items[*(uint *)(lVar28 + 0xc0 + uVar15 * 4)].ptr)->
                 mask & *(uint *)(ray + k * 4 + 0x90)) != 0) goto LAB_00706bfe;
            uVar36 = uVar36 ^ 1L << (uVar15 & 0x3f);
          } while (uVar36 != 0);
          uVar38 = 0;
        }
      }
      fVar67 = *(float *)(lVar28 + 0x60);
      fVar73 = *(float *)(lVar28 + 100);
      fVar48 = *(float *)(lVar28 + 0x68);
      fVar53 = *(float *)(lVar28 + 0x6c);
      fVar103 = *(float *)(lVar28 + 0x70);
      fVar105 = *(float *)(lVar28 + 0x74);
      fVar107 = *(float *)(lVar28 + 0x78);
      fVar109 = *(float *)(lVar28 + 0x7c);
      fVar91 = *(float *)(lVar28 + 0x80);
      fVar93 = *(float *)(lVar28 + 0x84);
      fVar95 = *(float *)(lVar28 + 0x88);
      fVar97 = *(float *)(lVar28 + 0x8c);
      fVar44 = fVar67 - *pfVar4;
      fVar54 = fVar73 - pfVar4[1];
      fVar59 = fVar48 - pfVar4[2];
      fVar64 = fVar53 - pfVar4[3];
      fVar81 = fVar103 - *pfVar5;
      fVar83 = fVar105 - pfVar5[1];
      fVar84 = fVar107 - pfVar5[2];
      fVar86 = fVar109 - pfVar5[3];
      fVar49 = fVar91 - *pfVar6;
      fVar58 = fVar93 - pfVar6[1];
      fVar60 = fVar95 - pfVar6[2];
      fVar65 = fVar97 - pfVar6[3];
      fVar106 = *pfVar3 - fVar67;
      fVar110 = pfVar3[1] - fVar73;
      fVar112 = pfVar3[2] - fVar48;
      fVar114 = pfVar3[3] - fVar53;
      fVar39 = *pfVar1 - fVar103;
      fVar43 = pfVar1[1] - fVar105;
      fVar47 = pfVar1[2] - fVar107;
      fVar52 = pfVar1[3] - fVar109;
      fVar66 = *pfVar2 - fVar91;
      fVar71 = pfVar2[1] - fVar93;
      fVar76 = pfVar2[2] - fVar95;
      fVar78 = pfVar2[3] - fVar97;
      fVar67 = fVar67 - fVar37;
      fVar73 = fVar73 - fVar37;
      fVar48 = fVar48 - fVar37;
      fVar53 = fVar53 - fVar37;
      fVar91 = fVar91 - fVar55;
      fVar93 = fVar93 - fVar55;
      fVar95 = fVar95 - fVar55;
      fVar97 = fVar97 - fVar55;
      fVar108 = fVar45 * fVar91 - fVar61 * fVar67;
      fVar111 = fVar45 * fVar93 - fVar61 * fVar73;
      fVar113 = fVar45 * fVar95 - fVar61 * fVar48;
      fVar115 = fVar45 * fVar97 - fVar61 * fVar53;
      fVar87 = fVar39 * fVar49 - fVar81 * fVar66;
      fVar90 = fVar43 * fVar58 - fVar83 * fVar71;
      fVar94 = fVar47 * fVar60 - fVar84 * fVar76;
      fVar98 = fVar52 * fVar65 - fVar86 * fVar78;
      fVar103 = fVar103 - fVar41;
      fVar105 = fVar105 - fVar41;
      fVar107 = fVar107 - fVar41;
      fVar109 = fVar109 - fVar41;
      fVar70 = fVar61 * fVar103 - fVar50 * fVar91;
      fVar72 = fVar61 * fVar105 - fVar50 * fVar93;
      fVar77 = fVar61 * fVar107 - fVar50 * fVar95;
      fVar80 = fVar61 * fVar109 - fVar50 * fVar97;
      fVar37 = fVar44 * fVar66 - fVar106 * fVar49;
      fVar41 = fVar54 * fVar71 - fVar110 * fVar58;
      fVar55 = fVar59 * fVar76 - fVar112 * fVar60;
      fVar40 = fVar64 * fVar78 - fVar114 * fVar65;
      fVar100 = fVar106 * fVar81 - fVar44 * fVar39;
      fVar101 = fVar110 * fVar83 - fVar54 * fVar43;
      fVar102 = fVar112 * fVar84 - fVar59 * fVar47;
      fVar104 = fVar114 * fVar86 - fVar64 * fVar52;
      fVar89 = fVar50 * fVar67 - fVar45 * fVar103;
      fVar92 = fVar50 * fVar73 - fVar45 * fVar105;
      fVar96 = fVar50 * fVar48 - fVar45 * fVar107;
      fVar99 = fVar50 * fVar53 - fVar45 * fVar109;
      fVar116 = fVar45 * fVar87 + fVar50 * fVar37 + fVar61 * fVar100;
      fVar117 = fVar45 * fVar90 + fVar50 * fVar41 + fVar61 * fVar101;
      fVar118 = fVar45 * fVar94 + fVar50 * fVar55 + fVar61 * fVar102;
      fVar119 = fVar45 * fVar98 + fVar50 * fVar40 + fVar61 * fVar104;
      uVar42 = (uint)fVar116 & 0x80000000;
      uVar46 = (uint)fVar117 & 0x80000000;
      uVar51 = (uint)fVar118 & 0x80000000;
      uVar56 = (uint)fVar119 & 0x80000000;
      fVar66 = (float)((uint)(fVar106 * fVar70 + fVar39 * fVar108 + fVar66 * fVar89) ^ uVar42);
      fVar71 = (float)((uint)(fVar110 * fVar72 + fVar43 * fVar111 + fVar71 * fVar92) ^ uVar46);
      fVar76 = (float)((uint)(fVar112 * fVar77 + fVar47 * fVar113 + fVar76 * fVar96) ^ uVar51);
      fVar78 = (float)((uint)(fVar114 * fVar80 + fVar52 * fVar115 + fVar78 * fVar99) ^ uVar56);
      fVar45 = (float)((uint)(fVar70 * fVar44 + fVar108 * fVar81 + fVar89 * fVar49) ^ uVar42);
      fVar50 = (float)((uint)(fVar72 * fVar54 + fVar111 * fVar83 + fVar92 * fVar58) ^ uVar46);
      fVar61 = (float)((uint)(fVar77 * fVar59 + fVar113 * fVar84 + fVar96 * fVar60) ^ uVar51);
      fVar39 = (float)((uint)(fVar80 * fVar64 + fVar115 * fVar86 + fVar99 * fVar65) ^ uVar56);
      fVar43 = ABS(fVar116);
      fVar47 = ABS(fVar117);
      fVar52 = ABS(fVar118);
      fVar44 = ABS(fVar119);
      bVar21 = ((0.0 <= fVar45 && 0.0 <= fVar66) && fVar116 != 0.0) && fVar66 + fVar45 <= fVar43;
      bVar22 = ((0.0 <= fVar50 && 0.0 <= fVar71) && fVar117 != 0.0) && fVar71 + fVar50 <= fVar47;
      bVar23 = ((0.0 <= fVar61 && 0.0 <= fVar76) && fVar118 != 0.0) && fVar76 + fVar61 <= fVar52;
      bVar24 = ((0.0 <= fVar39 && 0.0 <= fVar78) && fVar119 != 0.0) && fVar78 + fVar39 <= fVar44;
      auVar20._4_4_ = -(uint)bVar22;
      auVar20._0_4_ = -(uint)bVar21;
      auVar20._8_4_ = -(uint)bVar23;
      auVar20._12_4_ = -(uint)bVar24;
      uVar38 = movmskps(uVar38,auVar20);
      unaff_R14 = (ulong *)(ulong)uVar38;
      if (uVar38 != 0) {
        fVar45 = (float)(uVar42 ^ (uint)(fVar67 * fVar87 + fVar103 * fVar37 + fVar91 * fVar100));
        fVar50 = (float)(uVar46 ^ (uint)(fVar73 * fVar90 + fVar105 * fVar41 + fVar93 * fVar101));
        fVar55 = (float)(uVar51 ^ (uint)(fVar48 * fVar94 + fVar107 * fVar55 + fVar95 * fVar102));
        fVar61 = (float)(uVar56 ^ (uint)(fVar53 * fVar98 + fVar109 * fVar40 + fVar97 * fVar104));
        fVar37 = *(float *)(ray + k * 4 + 0x30);
        fVar41 = *(float *)(ray + k * 4 + 0x80);
        auVar18._4_4_ = -(uint)((fVar50 <= fVar41 * fVar47 && fVar37 * fVar47 < fVar50) && bVar22);
        auVar18._0_4_ = -(uint)((fVar45 <= fVar41 * fVar43 && fVar37 * fVar43 < fVar45) && bVar21);
        auVar18._8_4_ = -(uint)((fVar55 <= fVar41 * fVar52 && fVar37 * fVar52 < fVar55) && bVar23);
        auVar18._12_4_ = -(uint)((fVar61 <= fVar41 * fVar44 && fVar37 * fVar44 < fVar61) && bVar24);
        uVar38 = movmskps(uVar38,auVar18);
        unaff_R14 = (ulong *)(ulong)uVar38;
        if (uVar38 != 0) {
          uVar36 = (ulong)(uVar38 & 0xff);
          do {
            uVar15 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            if ((((context->scene->geometries).items[*(uint *)(lVar28 + 0xc0 + uVar15 * 4)].ptr)->
                 mask & *(uint *)(ray + k * 4 + 0x90)) != 0) goto LAB_00706bfe;
            uVar36 = uVar36 ^ 1L << (uVar15 & 0x3f);
          } while (uVar36 != 0);
          unaff_R14 = (ulong *)0x0;
        }
      }
    }
  } while( true );
LAB_00706bfe:
  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
  goto LAB_00706c0a;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }